

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RegisterStruct
          (ConversionStream *this,iterator *Token)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  pointer pHVar4;
  Char *Message;
  char (*in_RCX) [66];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  String local_170;
  undefined1 local_150 [8];
  string err_2;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_120;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_118;
  _List_node_base *local_110;
  String local_108;
  undefined1 local_e8 [8];
  string err_1;
  char *local_b0;
  pair<const_char_*,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_> local_a8;
  String *local_98;
  String *StructName;
  undefined1 local_70 [8];
  string err;
  undefined1 local_38 [8];
  string msg;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = Token;
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar4->Type == kw_struct) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
    bVar2 = std::operator==(&pHVar4->Literal,"struct");
    if (bVar2) goto LAB_00294edd;
  }
  FormatString<char[26],char[66]>
            ((string *)local_38,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"Token->Type == TokenType::kw_struct && Token->Literal == \"struct\"",
             in_RCX);
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"RegisterStruct",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x473);
  std::__cxx11::string::~string((string *)local_38);
LAB_00294edd:
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar3 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err.field_2 + 8));
  bVar2 = false;
  if (bVar3) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
    bVar2 = pHVar4->Type == Identifier;
  }
  if (!bVar2) {
    FormatString<char[20]>((string *)local_70,(char (*) [20])"Identifier expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&StructName,this,
               (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x478,in_R8,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&StructName);
    std::__cxx11::string::~string((string *)&StructName);
    std::__cxx11::string::~string((string *)local_70);
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  local_98 = &pHVar4->Literal;
  local_b0 = (char *)std::__cxx11::string::c_str();
  local_a8 = std::make_pair<char_const*,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&>
                       (&local_b0,
                        (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  std::
  unordered_map<Diligent::HashMapStringKey,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>>
  ::insert<std::pair<char_const*,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>
            ((unordered_map<Diligent::HashMapStringKey,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>>
              *)&this->m_StructDefinitions,&local_a8);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  err_1.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar3 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err_1.field_2 + 8));
  bVar2 = false;
  if (bVar3) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
    bVar2 = pHVar4->Type == OpenBrace;
  }
  if (!bVar2) {
    FormatString<char[20]>((string *)local_e8,(char (*) [20])"Open brace expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_108,this,(_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_
               ,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x480,in_R8,(char (*) [2])0x46b1a3,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)local_e8);
  }
  local_118._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  local_120._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  local_110 = (_List_node_base *)
              Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        (&local_118,&local_120,*(_List_node_base **)msg.field_2._8_8_);
  uVar1 = msg.field_2._8_8_;
  *(_List_node_base **)msg.field_2._8_8_ = local_110;
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=((_Self *)uVar1,(_Self *)((long)&err_2.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[38],std::__cxx11::string,char[2]>
              ((string *)local_150,(Diligent *)"Missing closing brace for structure \"",
               (char (*) [38])local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x482bc1,
               (char (*) [2])in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_170,this,(_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_
               ,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x484,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
               ,(char (*) [2])0x46b1a3,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_150);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RegisterStruct(TokenListType::iterator& Token)
{
    // struct VSOutput
    // ^
    VERIFY_EXPR(Token->Type == TokenType::kw_struct && Token->Literal == "struct");

    ++Token;
    // struct VSOutput
    //        ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier, "Identifier expected");
    auto& StructName = Token->Literal;
    m_StructDefinitions.insert(std::make_pair(StructName.c_str(), Token));

    ++Token;
    // struct VSOutput
    // {
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenBrace, "Open brace expected");

    // Find closing brace
    Token = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), Token);
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Missing closing brace for structure \"", StructName, "\"");
    // }
    // ^
    ++Token;
}